

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode
TA_CallFunc(TA_ParamHolder *param,TA_Integer startIdx,TA_Integer endIdx,TA_Integer *outBegIdx,
           TA_Integer *outNbElement)

{
  int *piVar1;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  TA_RetCode TVar3;
  
  TVar3 = TA_BAD_PARAM;
  if (outNbElement != (TA_Integer *)0x0 &&
      (outBegIdx != (TA_Integer *)0x0 && param != (TA_ParamHolder *)0x0)) {
    piVar1 = (int *)param->hiddenData;
    TVar3 = TA_INVALID_PARAM_HOLDER;
    if (((*piVar1 == -0x5dfd4dfe) && (TVar3 = TA_INPUT_NOT_ALL_INITIALIZE, piVar1[8] == 0)) &&
       (TVar3 = TA_OUTPUT_NOT_ALL_INITIALIZE, piVar1[9] == 0)) {
      if (*(long *)(piVar1 + 10) == 0) {
        return TA_INVALID_HANDLE;
      }
      lVar2 = *(long *)(*(long *)(piVar1 + 10) + 0x30);
      TVar3 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
      if ((lVar2 != 0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)(lVar2 + 0x28), UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        TVar3 = (*UNRECOVERED_JUMPTABLE)();
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

TA_RetCode TA_CallFunc( const TA_ParamHolder *param,
                        TA_Integer            startIdx,
                        TA_Integer            endIdx,
                        TA_Integer           *outBegIdx,
                        TA_Integer           *outNbElement )
{
   TA_RetCode retCode;
   const TA_ParamHolderPriv *paramHolderPriv;

   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   TA_FrameFunction function;

   if( (param == NULL) ||
       (outBegIdx == NULL) ||
       (outNbElement == NULL) )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Check that all parameters are initialize (except the optInput). */
   if( paramHolderPriv->inBitmap != 0 )
   {
      return TA_INPUT_NOT_ALL_INITIALIZE;
   }

   if( paramHolderPriv->outBitmap != 0 )
   {
      return TA_OUTPUT_NOT_ALL_INITIALIZE;
   }

   /* Get the pointer on the function */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   funcDef = (const TA_FuncDef *)funcInfo->handle;
   if( !funcDef ) return TA_INTERNAL_ERROR(2);
   function = funcDef->function;
   if( !function ) return TA_INTERNAL_ERROR(2);

   /* Perform the function call. */
   retCode = (*function)( paramHolderPriv, startIdx, endIdx,
                          outBegIdx, outNbElement );
   return retCode;
}